

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void IsoWriter::writeIcbTag(bool namedStream,uint8_t *buffer,FileTypes fileType)

{
  undefined2 uVar1;
  undefined2 uVar2;
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\x04';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\x01';
  buffer[9] = '\0';
  buffer[0xb] = (uint8_t)fileType;
  uVar1 = 0x2021;
  uVar2 = 0x21;
  if ((fileType != File) && (fileType != RealtimeFile)) {
    uVar1 = 0x2020;
    uVar2 = 0x20;
  }
  *(undefined2 *)(buffer + 0x12) = uVar2;
  if (namedStream) {
    *(undefined2 *)(buffer + 0x12) = uVar1;
  }
  return;
}

Assistant:

void IsoWriter::writeIcbTag(const bool namedStream, uint8_t *buffer, FileTypes fileType)
{
    const auto buff32 = reinterpret_cast<uint32_t *>(buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(buffer);

    // icb tag
    buff32[0] = 0;  // Prior Recorded Number of Direct Entries
    buff16[2] = 4;  // Strategy Type
    buff16[3] = 0;  // Strategy parameters
    buff16[4] = 1;  // Maximum Number of Entries
    // skip reserved byte
    buffer[11] = static_cast<uint8_t>(fileType);  // metadata file type
    // skip 6 byte zero Parent ICB Location
    if (fileType == FileTypes::File || fileType == FileTypes::RealtimeFile)
        buff16[18 / 2] = 0x0021;  // flags: archive + long AD
    else
        buff16[18 / 2] = 0x0020;  // flags: archive
    if (namedStream)
        buff16[18 / 2] += 0x2000;  // flags: stream
}